

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player_cycle_2.h
# Opt level: O1

void __thiscall PlayerCycle_2::PlayerCycle_2(PlayerCycle_2 *this,string *name)

{
  pointer pcVar1;
  int iVar2;
  
  (this->super_Player)._vptr_Player = (_func_int **)&PTR__Player_0010c820;
  (this->super_Player).m_name._M_dataplus._M_p = (pointer)&(this->super_Player).m_name.field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_Player).m_name,pcVar1,pcVar1 + name->_M_string_length);
  (this->super_Player)._vptr_Player = (_func_int **)&PTR__Player_0010c908;
  iVar2 = rand();
  this->m_play = iVar2 % 3;
  iVar2 = rand();
  this->m_up = iVar2 % 2;
  return;
}

Assistant:

PlayerCycle_2(const std::string& name) :
      Player(name),
      m_play(rand()%3),
      m_up(rand()%2)
   {}